

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radio.cpp
# Opt level: O2

int __thiscall zmq::radio_session_t::push_msg(radio_session_t *this,msg_t *msg_)

{
  byte bVar1;
  int iVar2;
  void *__s1;
  size_t sVar3;
  char *errmsg_;
  int *piVar4;
  int iVar5;
  char *pcVar6;
  msg_t join_leave_msg;
  
  bVar1 = msg_t::flags(msg_);
  if ((bVar1 & 2) != 0) {
    __s1 = msg_t::data(msg_);
    sVar3 = msg_t::size(msg_);
    if (4 < sVar3) {
      iVar2 = bcmp(__s1,"\x04JOIN",5);
      if (iVar2 == 0) {
        iVar5 = (int)sVar3 + -5;
        pcVar6 = (char *)((long)__s1 + 5);
        iVar2 = msg_t::init_join(&join_leave_msg);
LAB_0016e04b:
        if (iVar2 != 0) {
          piVar4 = __errno_location();
          errmsg_ = strerror(*piVar4);
          fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radio.cpp"
                  ,0xf0);
          fflush(_stderr);
          zmq_abort(errmsg_);
        }
        iVar2 = msg_t::set_group(&join_leave_msg,pcVar6,(long)iVar5);
        iVar5 = (int)pcVar6;
        if (iVar2 != 0) {
          piVar4 = __errno_location();
          pcVar6 = strerror(*piVar4);
          iVar5 = 0x18cdb5;
          fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radio.cpp"
                  ,0xf4);
          fflush(_stderr);
          zmq_abort(pcVar6);
        }
        iVar2 = msg_t::close(msg_,iVar5);
        if (iVar2 != 0) {
          piVar4 = __errno_location();
          pcVar6 = strerror(*piVar4);
          fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radio.cpp"
                  ,0xf8);
          fflush(_stderr);
          zmq_abort(pcVar6);
        }
        *(undefined8 *)((long)&msg_->_u + 0x30) = join_leave_msg._u._48_8_;
        *(undefined8 *)((long)&msg_->_u + 0x38) = join_leave_msg._u._56_8_;
        *(undefined8 *)((long)&msg_->_u + 0x20) = join_leave_msg._u._32_8_;
        *(undefined8 *)((long)&msg_->_u + 0x28) = join_leave_msg._u._40_8_;
        (msg_->_u).cmsg.size = join_leave_msg._u.cmsg.size;
        *(undefined8 *)((long)&msg_->_u + 0x18) = join_leave_msg._u._24_8_;
        (msg_->_u).base.metadata = join_leave_msg._u.base.metadata;
        (msg_->_u).lmsg.content = join_leave_msg._u.lmsg.content;
        iVar2 = session_base_t::push_msg(&this->super_session_base_t,msg_);
        return iVar2;
      }
      if (sVar3 != 5) {
        iVar2 = bcmp(__s1,"\x05LEAVE",6);
        if (iVar2 == 0) {
          iVar5 = (int)sVar3 + -6;
          pcVar6 = (char *)((long)__s1 + 6);
          iVar2 = msg_t::init_leave(&join_leave_msg);
          goto LAB_0016e04b;
        }
      }
    }
  }
  iVar2 = session_base_t::push_msg(&this->super_session_base_t,msg_);
  return iVar2;
}

Assistant:

int zmq::radio_session_t::push_msg (msg_t *msg_)
{
    if (msg_->flags () & msg_t::command) {
        char *command_data = static_cast<char *> (msg_->data ());
        const size_t data_size = msg_->size ();

        int group_length;
        const char *group;

        msg_t join_leave_msg;
        int rc;

        //  Set the msg type to either JOIN or LEAVE
        if (data_size >= 5 && memcmp (command_data, "\4JOIN", 5) == 0) {
            group_length = static_cast<int> (data_size) - 5;
            group = command_data + 5;
            rc = join_leave_msg.init_join ();
        } else if (data_size >= 6 && memcmp (command_data, "\5LEAVE", 6) == 0) {
            group_length = static_cast<int> (data_size) - 6;
            group = command_data + 6;
            rc = join_leave_msg.init_leave ();
        }
        //  If it is not a JOIN or LEAVE just push the message
        else
            return session_base_t::push_msg (msg_);

        errno_assert (rc == 0);

        //  Set the group
        rc = join_leave_msg.set_group (group, group_length);
        errno_assert (rc == 0);

        //  Close the current command
        rc = msg_->close ();
        errno_assert (rc == 0);

        //  Push the join or leave command
        *msg_ = join_leave_msg;
        return session_base_t::push_msg (msg_);
    }
    return session_base_t::push_msg (msg_);
}